

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddBddComposeRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *proj)

{
  uint uVar1;
  uint uVar2;
  DdNode *f_00;
  DdNode *pDVar3;
  DdNode *h;
  uint local_94;
  uint local_90;
  uint local_88;
  int comple;
  uint topindex;
  uint topg;
  uint topf;
  uint v;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *g0;
  DdNode *g1;
  DdNode *f0;
  DdNode *f1;
  DdNode *G;
  DdNode *F;
  DdNode *proj_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  uVar1 = dd->perm[proj->index];
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (f_00->index == 0x7fffffff) {
    local_90 = f_00->index;
  }
  else {
    local_90 = dd->perm[f_00->index];
  }
  dd_local = (DdManager *)f;
  if (local_90 <= uVar1) {
    uVar2 = (uint)f & 1;
    pDVar3 = cuddCacheLookup(dd,0x2e,f_00,g,proj);
    if (pDVar3 == (DdNode *)0x0) {
      if (local_90 == uVar1) {
        t = cuddBddIteRecur(dd,g,(f_00->type).kids.T,(f_00->type).kids.E);
        if (t == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
      }
      else {
        pDVar3 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
        if (pDVar3->index == 0x7fffffff) {
          local_94 = pDVar3->index;
        }
        else {
          local_94 = dd->perm[pDVar3->index];
        }
        if (local_94 < local_90) {
          local_88 = pDVar3->index;
          g1 = f_00;
          f0 = f_00;
        }
        else {
          local_88 = f_00->index;
          f0 = (f_00->type).kids.T;
          g1 = (f_00->type).kids.E;
        }
        r = g;
        g0 = g;
        if (local_94 <= local_90) {
          g0 = (pDVar3->type).kids.T;
          r = (pDVar3->type).kids.E;
          if (g != pDVar3) {
            g0 = (DdNode *)((ulong)g0 ^ 1);
            r = (DdNode *)((ulong)r ^ 1);
          }
        }
        pDVar3 = cuddBddComposeRecur(dd,f0,g0,proj);
        if (pDVar3 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
        h = cuddBddComposeRecur(dd,g1,r,proj);
        if (h == (DdNode *)0x0) {
          Cudd_IterDerefBdd(dd,pDVar3);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
        t = cuddBddIteRecur(dd,dd->vars[local_88],pDVar3,h);
        if (t == (DdNode *)0x0) {
          Cudd_IterDerefBdd(dd,pDVar3);
          Cudd_IterDerefBdd(dd,h);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + 1;
        Cudd_IterDerefBdd(dd,pDVar3);
        Cudd_IterDerefBdd(dd,h);
        *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + -1;
      }
      cuddCacheInsert(dd,0x2e,f_00,g,proj,t);
      dd_local = (DdManager *)((ulong)t ^ (long)(int)uVar2);
    }
    else {
      dd_local = (DdManager *)((ulong)pDVar3 ^ (long)(int)uVar2);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddBddComposeRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * proj)
{
    DdNode      *F, *G, *f1, *f0, *g1, *g0, *r, *t, *e;
    unsigned int v, topf, topg, topindex;
    int         comple;

    statLine(dd);
    v = dd->perm[proj->index];
    F = Cudd_Regular(f);
    topf = cuddI(dd,F->index);

    /* Terminal case. Subsumes the test for constant f. */
    if (topf > v) return(f);

    /* We solve the problem for a regular pointer, and then complement
    ** the result if the pointer was originally complemented.
    */
    comple = Cudd_IsComplement(f);

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_BDD_COMPOSE_RECUR_TAG,F,g,proj);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    if (topf == v) {
        /* Compose. */
        f1 = cuddT(F);
        f0 = cuddE(F);
        r = cuddBddIteRecur(dd, g, f1, f0);
        if (r == NULL) return(NULL);
    } else {
        /* Compute cofactors of f and g. Remember the index of the top
        ** variable.
        */
        G = Cudd_Regular(g);
        topg = cuddI(dd,G->index);
        if (topf > topg) {
            topindex = G->index;
            f1 = f0 = F;
        } else {
            topindex = F->index;
            f1 = cuddT(F);
            f0 = cuddE(F);
        }
        if (topg > topf) {
            g1 = g0 = g;
        } else {
            g1 = cuddT(G);
            g0 = cuddE(G);
            if (g != G) {
                g1 = Cudd_Not(g1);
                g0 = Cudd_Not(g0);
            }
        }
        /* Recursive step. */
        t = cuddBddComposeRecur(dd, f1, g1, proj);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddBddComposeRecur(dd, f0, g0, proj);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
        cuddRef(e);

        r = cuddBddIteRecur(dd, dd->vars[topindex], t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, t);
            Cudd_IterDerefBdd(dd, e);
            return(NULL);
        }
        cuddRef(r);
        Cudd_IterDerefBdd(dd, t); /* t & e not necessarily part of r */
        Cudd_IterDerefBdd(dd, e);
        cuddDeref(r);
    }

    cuddCacheInsert(dd,DD_BDD_COMPOSE_RECUR_TAG,F,g,proj,r);

    return(Cudd_NotCond(r,comple));

}